

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_api_wrapper.cpp
# Opt level: O3

int duckdb_shell_sqlite3_complete(char *zSql)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  idx_t idx;
  ulong uVar4;
  long lVar5;
  
  bVar3 = true;
  do {
    bVar2 = *zSql;
    if (bVar2 < 0x20) {
      if ((bVar2 - 9 < 2) || (bVar2 - 0xc < 2)) goto switchD_00cfc2e4_caseD_20;
      if (bVar2 != 0) goto switchD_00cfc2e4_caseD_21;
LAB_00cfc3fa:
      bVar3 = !bVar3;
      goto LAB_00cfc3ff;
    }
    if (0x2c < bVar2) {
      if (bVar2 == 0x2d) {
        if (((byte *)zSql)[1] == 0x2d) {
          bVar2 = 0x2d;
          while( true ) {
            if (bVar2 == 0) goto LAB_00cfc3fa;
            if (bVar2 == 10) break;
            bVar2 = ((byte *)zSql)[1];
            zSql = (char *)((byte *)zSql + 1);
          }
          goto switchD_00cfc2e4_caseD_20;
        }
      }
      else if (bVar2 == 0x2f) {
        if (((byte *)zSql)[1] == 0x2a) {
          zSql = (char *)((byte *)zSql + 3);
          do {
            if (((byte *)zSql)[-1] == 0x2a) {
              if (*zSql == 0x2f) goto switchD_00cfc2e4_caseD_20;
            }
            else if (((byte *)zSql)[-1] == 0) goto LAB_00cfc3f6;
            zSql = (char *)((byte *)zSql + 1);
          } while( true );
        }
      }
      else if (bVar2 == 0x3b) {
        bVar3 = false;
        goto switchD_00cfc2e4_caseD_20;
      }
      goto switchD_00cfc2e4_caseD_21;
    }
    switch(bVar2) {
    case 0x20:
      break;
    default:
      goto switchD_00cfc2e4_caseD_21;
    case 0x22:
    case 0x27:
      do {
        bVar1 = ((byte *)zSql)[1];
        zSql = (char *)((byte *)zSql + 1);
        if (bVar1 == 0) break;
      } while (bVar1 != bVar2);
      if (bVar1 == 0) {
LAB_00cfc3f6:
        bVar3 = false;
LAB_00cfc3ff:
        return (int)bVar3;
      }
      break;
    case 0x24:
      lVar5 = 0;
      for (uVar4 = 1; bVar2 = ((byte *)zSql)[uVar4], bVar2 != 0; uVar4 = uVar4 + 1) {
        if (bVar2 == 0x24) {
          if (lVar5 != 1) {
            zSql = skipDollarQuotedString
                             ((char *)((byte *)zSql + (2 - lVar5)),(char *)((byte *)zSql + 1),-lVar5
                             );
            if ((byte *)zSql == (byte *)0x0) goto LAB_00cfc3f6;
            goto switchD_00cfc2e4_caseD_20;
          }
          break;
        }
        if (((0x19 < (byte)(bVar2 + 0xbf)) && (-1 < (char)bVar2 && 0x19 < (byte)(bVar2 + 0x9f))) &&
           ((uVar4 < 2 || (9 < (byte)(bVar2 - 0x30))))) break;
        lVar5 = lVar5 + -1;
      }
switchD_00cfc2e4_caseD_21:
      bVar3 = true;
    }
switchD_00cfc2e4_caseD_20:
    zSql = (char *)((byte *)zSql + 1);
  } while( true );
}

Assistant:

int sqlite3_complete(const char *zSql) {
	auto state = SQLParseState::NORMAL;

	for (; *zSql; zSql++) {
		SQLParseState next_state;
		switch (*zSql) {
		case ';':
			next_state = SQLParseState::SEMICOLON;
			break;
		case ' ':
		case '\r':
		case '\t':
		case '\n':
		case '\f': { /* White space is ignored */
			next_state = SQLParseState::WHITESPACE;
			break;
		}
		case '/': { /* C-style comments */
			if (zSql[1] != '*') {
				next_state = SQLParseState::NORMAL;
				break;
			}
			zSql += 2;
			while (zSql[0] && (zSql[0] != '*' || zSql[1] != '/')) {
				zSql++;
			}
			if (zSql[0] == 0) {
				// unterminated c-style string
				return 0;
			}
			zSql++;
			next_state = SQLParseState::WHITESPACE;
			break;
		}
		case '-': { /* SQL-style comments from "--" to end of line */
			if (zSql[1] != '-') {
				next_state = SQLParseState::NORMAL;
				break;
			}
			while (*zSql && *zSql != '\n') {
				zSql++;
			}
			if (*zSql == 0) {
				// unterminated SQL-style comment - return whether or not we had a semicolon right before it
				return state == SQLParseState::SEMICOLON ? 1 : 0;
			}
			next_state = SQLParseState::WHITESPACE;
			break;
		}
		case '$': { /* Dollar-quoted strings */
			// check if this is a dollar-quoted string
			idx_t next_dollar = 0;
			for (idx_t idx = 1; zSql[idx]; idx++) {
				if (zSql[idx] == '$') {
					// found the next dollar
					next_dollar = idx;
					break;
				}
				// all characters can be between A-Z, a-z or \200 - \377
				if (zSql[idx] >= 'A' && zSql[idx] <= 'Z') {
					continue;
				}
				if (zSql[idx] >= 'a' && zSql[idx] <= 'z') {
					continue;
				}
				if (zSql[idx] >= '\200' && zSql[idx] <= '\377') {
					continue;
				}
				// the first character CANNOT be a numeric, only subsequent characters
				if (idx > 1 && zSql[idx] >= '0' && zSql[idx] <= '9') {
					continue;
				}
				// not a dollar quoted string
				break;
			}
			if (next_dollar == 0) {
				// not a dollar quoted string
				next_state = SQLParseState::NORMAL;
				break;
			}
			auto start = zSql + 1;
			zSql += next_dollar;
			const char *delimiterStart = start;
			idx_t delimiterLength = zSql - start;
			zSql++;
			// skip the dollar quoted string
			zSql = skipDollarQuotedString(zSql, delimiterStart, delimiterLength);
			if (!zSql) {
				// unterminated dollar string
				return 0;
			}
			next_state = SQLParseState::WHITESPACE;
			break;
		}
			//		case '`': /* Grave-accent quoted symbols used by MySQL */
		case '"': /* single- and double-quoted strings */
		case '\'': {
			int c = *zSql;
			zSql++;
			while (*zSql && *zSql != c) {
				zSql++;
			}
			if (*zSql == 0) {
				// unterminated single or double quoted string
				return 0;
			}
			next_state = SQLParseState::WHITESPACE;
			break;
		}
		default:
			next_state = SQLParseState::NORMAL;
		}
		// white space is ignored (no change in state)
		if (next_state != SQLParseState::WHITESPACE) {
			state = next_state;
		}
	}
	return state == SQLParseState::SEMICOLON ? 1 : 0;
}